

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quirrel_parser.cpp
# Opt level: O0

Node * __thiscall Parser::parseLocalVarDeclaration(Parser *this)

{
  bool bVar1;
  uint uVar2;
  void *pvVar3;
  socklen_t *in_RCX;
  sockaddr *extraout_RDX;
  sockaddr *__addr;
  sockaddr *extraout_RDX_00;
  sockaddr *extraout_RDX_01;
  sockaddr *extraout_RDX_02;
  sockaddr *extraout_RDX_03;
  sockaddr *__addr_00;
  sockaddr *extraout_RDX_04;
  sockaddr *extraout_RDX_05;
  sockaddr *extraout_RDX_06;
  sockaddr *psVar4;
  sockaddr *extraout_RDX_07;
  Parser *in_RDI;
  Parser *in_stack_000000a8;
  Node *list_1;
  Node *list;
  vector<Node_*,_std::allocator<Node_*>_> varValues;
  vector<Node_*,_std::allocator<Node_*>_> varKeys;
  Token *tk;
  int in_stack_00000158;
  int in_stack_0000015c;
  char *in_stack_00000160;
  int in_stack_0000016c;
  CompilationContext *in_stack_00000170;
  value_type *in_stack_fffffffffffffed8;
  Parser *in_stack_fffffffffffffee0;
  CompilationContext *in_stack_fffffffffffffee8;
  Node *in_stack_fffffffffffffef0;
  undefined5 in_stack_fffffffffffffef8;
  undefined1 in_stack_fffffffffffffefd;
  undefined1 in_stack_fffffffffffffefe;
  undefined1 in_stack_fffffffffffffeff;
  Parser *in_stack_ffffffffffffff00;
  void *in_stack_ffffffffffffff20;
  uint7 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff37;
  byte bVar5;
  vector<Node_*,_std::allocator<Node_*>_> *in_stack_ffffffffffffff48;
  undefined7 in_stack_ffffffffffffff50;
  byte bVar6;
  Token *in_stack_ffffffffffffff58;
  Parser *in_stack_ffffffffffffff60;
  void *in_stack_ffffffffffffffb0;
  Parser *in_stack_ffffffffffffffb8;
  Node *local_8;
  
  std::vector<Node_*,_std::allocator<Node_*>_>::vector
            ((vector<Node_*,_std::allocator<Node_*>_> *)0x1210e5);
  std::vector<Node_*,_std::allocator<Node_*>_>::vector
            ((vector<Node_*,_std::allocator<Node_*>_> *)0x1210f2);
  psVar4 = extraout_RDX;
  do {
    if (((in_RDI->ctx->isError ^ 0xffU) & 1) == 0) break;
    uVar2 = accept(in_RDI,0x17,psVar4,in_RCX);
    if ((uVar2 & 1) == 0) {
      uVar2 = accept(in_RDI,0x19,__addr,in_RCX);
      if ((uVar2 & 1) == 0) {
        bVar1 = expect(in_stack_ffffffffffffffb8,
                       (TokenType)((ulong)in_stack_ffffffffffffffb0 >> 0x20));
        psVar4 = extraout_RDX_02;
        if (bVar1) {
          createIdentifierNode
                    (in_stack_ffffffffffffff00,
                     (Token *)CONCAT17(in_stack_fffffffffffffeff,
                                       CONCAT16(in_stack_fffffffffffffefe,
                                                CONCAT15(in_stack_fffffffffffffefd,
                                                         in_stack_fffffffffffffef8))));
          std::vector<Node_*,_std::allocator<Node_*>_>::push_back
                    ((vector<Node_*,_std::allocator<Node_*>_> *)in_stack_fffffffffffffee0,
                     in_stack_fffffffffffffed8);
          psVar4 = extraout_RDX_03;
        }
      }
      else {
        pvVar3 = operator_new(0x30);
        Node::Node(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
                   (Token *)in_stack_fffffffffffffee0);
        *(undefined4 *)((long)pvVar3 + 0x10) = 10;
        parseListOfVars((Parser *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30),
                        (Node *)in_RDI,(NodeType)((ulong)in_stack_ffffffffffffff20 >> 0x20));
        std::vector<Node_*,_std::allocator<Node_*>_>::push_back
                  ((vector<Node_*,_std::allocator<Node_*>_> *)in_stack_fffffffffffffef0,
                   (value_type *)in_stack_fffffffffffffee8);
        expect(in_stack_ffffffffffffffb8,(TokenType)((ulong)in_stack_ffffffffffffffb0 >> 0x20));
        psVar4 = extraout_RDX_01;
      }
    }
    else {
      in_stack_ffffffffffffff20 = operator_new(0x30);
      Node::Node(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
                 (Token *)in_stack_fffffffffffffee0);
      *(undefined4 *)((long)in_stack_ffffffffffffff20 + 0x10) = 0xb;
      in_stack_ffffffffffffffb0 = in_stack_ffffffffffffff20;
      parseListOfVars((Parser *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30),
                      (Node *)in_RDI,(NodeType)((ulong)in_stack_ffffffffffffff20 >> 0x20));
      std::vector<Node_*,_std::allocator<Node_*>_>::push_back
                ((vector<Node_*,_std::allocator<Node_*>_> *)in_stack_fffffffffffffef0,
                 (value_type *)in_stack_fffffffffffffee8);
      expect(in_stack_ffffffffffffffb8,(TokenType)((ulong)in_stack_ffffffffffffffb0 >> 0x20));
      psVar4 = extraout_RDX_00;
    }
    if ((in_RDI->ctx->isError & 1U) != 0) break;
    uVar2 = accept(in_RDI,6,psVar4,in_RCX);
    if ((uVar2 & 1) == 0) {
      uVar2 = accept(in_RDI,8,__addr_00,in_RCX);
      if (((uVar2 & 1) == 0) &&
         (in_stack_fffffffffffffefe = isEndOfStatement(in_stack_fffffffffffffee0),
         !(bool)in_stack_fffffffffffffefe)) {
        std::vector<Node_*,_std::allocator<Node_*>_>::push_back
                  ((vector<Node_*,_std::allocator<Node_*>_> *)in_stack_fffffffffffffee0,
                   in_stack_fffffffffffffed8);
        break;
      }
      std::vector<Node_*,_std::allocator<Node_*>_>::push_back
                ((vector<Node_*,_std::allocator<Node_*>_> *)in_stack_fffffffffffffee0,
                 in_stack_fffffffffffffed8);
      psVar4 = extraout_RDX_06;
    }
    else {
      in_stack_ffffffffffffff00 = (Parser *)parseTernaryOp(in_stack_000000a8);
      std::vector<Node_*,_std::allocator<Node_*>_>::push_back
                ((vector<Node_*,_std::allocator<Node_*>_> *)in_stack_fffffffffffffee0,
                 in_stack_fffffffffffffed8);
      in_stack_fffffffffffffeff = isEndOfStatement(in_stack_fffffffffffffee0);
      psVar4 = extraout_RDX_04;
      if (!(bool)in_stack_fffffffffffffeff) {
        expect(in_stack_ffffffffffffffb8,(TokenType)((ulong)in_stack_ffffffffffffffb0 >> 0x20));
        psVar4 = extraout_RDX_05;
      }
    }
  } while ((in_RDI->tok->type == TK_COMMA) ||
          (in_stack_fffffffffffffefd = isEndOfStatement(in_stack_fffffffffffffee0),
          psVar4 = extraout_RDX_07, !(bool)in_stack_fffffffffffffefd));
  bVar1 = std::vector<Node_*,_std::allocator<Node_*>_>::empty
                    ((vector<Node_*,_std::allocator<Node_*>_> *)in_stack_fffffffffffffef0);
  if (bVar1) {
    CompilationContext::error
              (in_stack_00000170,in_stack_0000016c,in_stack_00000160,in_stack_0000015c,
               in_stack_00000158);
    local_8 = (Node *)0x0;
  }
  else {
    bVar6 = 0;
    bVar5 = 0;
    if ((in_RDI->ctx->isError & 1U) == 0) {
      std::vector<Node_*,_std::allocator<Node_*>_>::vector
                ((vector<Node_*,_std::allocator<Node_*>_> *)(ulong)in_stack_ffffffffffffff30,
                 (vector<Node_*,_std::allocator<Node_*>_> *)in_RDI);
      bVar6 = 1;
      std::vector<Node_*,_std::allocator<Node_*>_>::vector
                ((vector<Node_*,_std::allocator<Node_*>_> *)
                 CONCAT17(bVar5,in_stack_ffffffffffffff30),
                 (vector<Node_*,_std::allocator<Node_*>_> *)in_RDI);
      bVar5 = 1;
      local_8 = createLocalVarDeclarationNode
                          (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                           (vector<Node_*,_std::allocator<Node_*>_> *)
                           CONCAT17(bVar6,in_stack_ffffffffffffff50),in_stack_ffffffffffffff48);
    }
    else {
      local_8 = (Node *)0x0;
    }
    in_stack_fffffffffffffef0 = local_8;
    if ((bVar5 & 1) != 0) {
      std::vector<Node_*,_std::allocator<Node_*>_>::~vector
                ((vector<Node_*,_std::allocator<Node_*>_> *)local_8);
    }
    if ((bVar6 & 1) != 0) {
      std::vector<Node_*,_std::allocator<Node_*>_>::~vector
                ((vector<Node_*,_std::allocator<Node_*>_> *)in_stack_fffffffffffffef0);
    }
  }
  std::vector<Node_*,_std::allocator<Node_*>_>::~vector
            ((vector<Node_*,_std::allocator<Node_*>_> *)in_stack_fffffffffffffef0);
  std::vector<Node_*,_std::allocator<Node_*>_>::~vector
            ((vector<Node_*,_std::allocator<Node_*>_> *)in_stack_fffffffffffffef0);
  return local_8;
}

Assistant:

Node * parseLocalVarDeclaration()
  {
    Token * tk = tok; // = "local"
    std::vector<Node *> varKeys;
    std::vector<Node *> varValues;
    while (!ctx.isError)
    {
      if (accept(TK_LBRACE))
      {
        Node * list = new Node(ctx, *tok);
        list->nodeType = PNT_LIST_OF_KEYS_TABLE;
        parseListOfVars(list, PNT_VAR_DECLARATOR);
        varKeys.push_back(list);
        expect(TK_RBRACE);
      }
      else if (accept(TK_LSQUARE))
      {
        Node * list = new Node(ctx, *tok);
        list->nodeType = PNT_LIST_OF_KEYS_ARRAY;
        parseListOfVars(list, PNT_VAR_DECLARATOR);
        varKeys.push_back(list);
        expect(TK_RSQUARE);
      }
      else if (expect(TK_IDENTIFIER))
      {
        varKeys.push_back(createIdentifierNode(*tok));
      }

      if (ctx.isError)
        break;

      if (accept(TK_ASSIGN))
      {
        varValues.push_back(parseTernaryOp());
        if (!isEndOfStatement())
          expect(TK_COMMA);
      }
      else if (accept(TK_COMMA) || isEndOfStatement())
      {
        varValues.push_back(nullptr);
      }
      else
      {
        varValues.push_back(nullptr);
        break;
      }

      if (tok->type != TK_COMMA && isEndOfStatement())
        break;
    }

    if (varKeys.empty())
    {
      ctx.error(124, "expected name of variable", tok->line, tok->column);
      return nullptr;
    }
    return ctx.isError ? nullptr : createLocalVarDeclarationNode(*tk, varKeys, varValues);
  }